

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flux_test.cpp
# Opt level: O0

void flux_test::copyTest(void)

{
  SystemImpl *this;
  SystemImpl *this_00;
  FlowExp *this_01;
  FlowExp *flux2;
  FlowExp *flux1;
  SystemImpl *s2;
  SystemImpl *s1;
  
  this = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this);
  this_00 = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this_00);
  this_01 = (FlowExp *)operator_new(0x38);
  FlowExp::FlowExp(this_01,(System *)this,(System *)this_00);
  return;
}

Assistant:

void flux_test::copyTest() {
    auto *s1 = new SystemImpl();
    auto *s2 = new SystemImpl();
    auto *flux1 = new FlowExp(s1, s2);
    auto *flux2 = flux1;
    assert(flux1 == flux2);
}